

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlParserInputBufferCreateFd(int fd,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  int fd_local;
  
  if (fd < 0) {
    _enc_local = (xmlParserInputBufferPtr)0x0;
  }
  else {
    _enc_local = xmlAllocParserInputBuffer(enc);
    if (_enc_local != (xmlParserInputBufferPtr)0x0) {
      _enc_local->context = (void *)(long)fd;
      _enc_local->readcallback = xmlFdRead;
      _enc_local->closecallback = xmlFdClose;
    }
  }
  return _enc_local;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFd(int fd, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (fd < 0) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = (void *) (ptrdiff_t) fd;
	ret->readcallback = xmlFdRead;
	ret->closecallback = xmlFdClose;
    }

    return(ret);
}